

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O0

int re2::utflen(char *s)

{
  int iVar1;
  Rune local_24;
  long lStack_20;
  Rune rune;
  long n;
  byte *pbStack_10;
  int c;
  char *s_local;
  
  lStack_20 = 0;
  pbStack_10 = (byte *)s;
  do {
    n._4_4_ = (uint)*pbStack_10;
    if (n._4_4_ < 0x80) {
      if (n._4_4_ == 0) {
        return (int)lStack_20;
      }
      pbStack_10 = pbStack_10 + 1;
    }
    else {
      iVar1 = chartorune(&local_24,(char *)pbStack_10);
      pbStack_10 = pbStack_10 + iVar1;
    }
    lStack_20 = lStack_20 + 1;
  } while( true );
}

Assistant:

int
utflen(const char *s)
{
	int c;
	long n;
	Rune rune;

	n = 0;
	for(;;) {
		c = *(unsigned char*)s;
		if(c < Runeself) {
			if(c == 0)
				return n;
			s++;
		} else
			s += chartorune(&rune, s);
		n++;
	}
	return 0;
}